

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_48f05::CleanTestCleanRsp::Run(CleanTestCleanRsp *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  TimeStamp TVar4;
  string err;
  Cleaner cleaner;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  Cleaner local_c0;
  
  iVar3 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule cat_rsp \n  command = cat $rspfile > $out\n  rspfile = $rspfile\n  rspfile_content = $in\nbuild in1: cat src1\nbuild out1: cat in1\nbuild in2: cat_rsp src2\n  rspfile=in2.rsp\nbuild out2: cat_rsp in2\n  rspfile=out2.rsp\n"
              ,(ManifestParserOptions)0x0);
  if (iVar3 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"in1",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  this_00 = &(this->super_CleanTest).fs_;
  VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"out1",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"in2.rsp",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"out2.rsp",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"in2",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"out2",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  Cleaner::Cleaner(&local_c0,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface);
  bVar2 = testing::Test::Check
                    (g_current_test,local_c0.cleaned_files_count_ == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                     ,0x182,"0 == cleaner.cleaned_files_count()");
  pTVar1 = g_current_test;
  if (bVar2) {
    iVar3 = Cleaner::CleanTarget(&local_c0,"out1");
    bVar2 = testing::Test::Check
                      (pTVar1,iVar3 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,0x183,"0 == cleaner.CleanTarget(\"out1\")");
    if (bVar2) {
      testing::Test::Check
                (g_current_test,local_c0.cleaned_files_count_ == 2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                 ,0x184,"2 == cleaner.cleaned_files_count()");
      pTVar1 = g_current_test;
      iVar3 = Cleaner::CleanTarget(&local_c0,"in2");
      bVar2 = testing::Test::Check
                        (pTVar1,iVar3 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                         ,0x185,"0 == cleaner.CleanTarget(\"in2\")");
      if (bVar2) {
        testing::Test::Check
                  (g_current_test,local_c0.cleaned_files_count_ == 2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                   ,0x186,"2 == cleaner.cleaned_files_count()");
        pTVar1 = g_current_test;
        iVar3 = Cleaner::CleanRule(&local_c0,"cat_rsp");
        bVar2 = testing::Test::Check
                          (pTVar1,iVar3 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x187,"0 == cleaner.CleanRule(\"cat_rsp\")");
        if (bVar2) {
          testing::Test::Check
                    (g_current_test,local_c0.cleaned_files_count_ == 2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                     ,0x188,"2 == cleaner.cleaned_files_count()");
          testing::Test::Check
                    (g_current_test,
                     (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count == 6,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                     ,0x18a,"6u == fs_.files_removed_.size()");
          pTVar1 = g_current_test;
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          local_100._M_string_length = 0;
          local_100.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"in1",&local_101);
          TVar4 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
          testing::Test::Check
                    (pTVar1,TVar4 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                     ,0x18e,"0 == fs_.Stat(\"in1\", &err)");
          std::__cxx11::string::~string((string *)&local_e0);
          pTVar1 = g_current_test;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"out1",&local_101);
          TVar4 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
          testing::Test::Check
                    (pTVar1,TVar4 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                     ,399,"0 == fs_.Stat(\"out1\", &err)");
          std::__cxx11::string::~string((string *)&local_e0);
          pTVar1 = g_current_test;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"in2",&local_101);
          TVar4 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
          testing::Test::Check
                    (pTVar1,TVar4 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                     ,400,"0 == fs_.Stat(\"in2\", &err)");
          std::__cxx11::string::~string((string *)&local_e0);
          pTVar1 = g_current_test;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"out2",&local_101);
          TVar4 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
          testing::Test::Check
                    (pTVar1,TVar4 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                     ,0x191,"0 == fs_.Stat(\"out2\", &err)");
          std::__cxx11::string::~string((string *)&local_e0);
          pTVar1 = g_current_test;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,"in2.rsp",&local_101);
          TVar4 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
          testing::Test::Check
                    (pTVar1,TVar4 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                     ,0x192,"0 == fs_.Stat(\"in2.rsp\", &err)");
          std::__cxx11::string::~string((string *)&local_e0);
          pTVar1 = g_current_test;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,"out2.rsp",&local_101);
          TVar4 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
          testing::Test::Check
                    (pTVar1,TVar4 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                     ,0x193,"0 == fs_.Stat(\"out2.rsp\", &err)");
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          goto LAB_0014af70;
        }
      }
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
LAB_0014af70:
  Cleaner::~Cleaner(&local_c0);
  return;
}

Assistant:

TEST_F(CleanTest, CleanRsp) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cat_rsp \n"
"  command = cat $rspfile > $out\n"
"  rspfile = $rspfile\n"
"  rspfile_content = $in\n"
"build in1: cat src1\n"
"build out1: cat in1\n"
"build in2: cat_rsp src2\n"
"  rspfile=in2.rsp\n"
"build out2: cat_rsp in2\n"
"  rspfile=out2.rsp\n"
));
  fs_.Create("in1", "");
  fs_.Create("out1", "");
  fs_.Create("in2.rsp", "");
  fs_.Create("out2.rsp", "");
  fs_.Create("in2", "");
  fs_.Create("out2", "");

  Cleaner cleaner(&state_, config_, &fs_);
  ASSERT_EQ(0, cleaner.cleaned_files_count());
  ASSERT_EQ(0, cleaner.CleanTarget("out1"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  ASSERT_EQ(0, cleaner.CleanTarget("in2"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  ASSERT_EQ(0, cleaner.CleanRule("cat_rsp"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());

  EXPECT_EQ(6u, fs_.files_removed_.size());

  // Check they are removed.
  string err;
  EXPECT_EQ(0, fs_.Stat("in1", &err));
  EXPECT_EQ(0, fs_.Stat("out1", &err));
  EXPECT_EQ(0, fs_.Stat("in2", &err));
  EXPECT_EQ(0, fs_.Stat("out2", &err));
  EXPECT_EQ(0, fs_.Stat("in2.rsp", &err));
  EXPECT_EQ(0, fs_.Stat("out2.rsp", &err));
}